

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          FixedArray<char,_1UL> *params_1,CappedArray<char,_14UL> *params_2)

{
  size_t __n;
  long lVar1;
  size_t size;
  char *__dest;
  long local_48 [3];
  
  local_48[0] = *(long *)(this + 8);
  local_48[1] = 1;
  local_48[2] = *(undefined8 *)params_1;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_48 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  heapString(__return_storage_ptr__,size);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __n = *(size_t *)(this + 8);
  if (__n != 0) {
    memcpy(__dest,*(void **)this,__n);
    __dest = __dest + __n;
  }
  *__dest = *(char *)&params->ptr;
  if (*(size_t *)params_1 != 0) {
    memcpy(__dest + 1,params_1 + 8,*(size_t *)params_1);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}